

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O0

BoundFunction * Js::BoundFunction::New(ScriptContext *scriptContext,ArgumentReader *args)

{
  Recycler *pRVar1;
  BoundFunction *this;
  JavascriptLibrary *this_00;
  DynamicType *type;
  Arguments local_70;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  BoundFunction *boundFunc;
  Recycler *recycler;
  ArgumentReader *args_local;
  ScriptContext *scriptContext_local;
  
  recycler = (Recycler *)args;
  args_local = (ArgumentReader *)scriptContext;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  boundFunc = (BoundFunction *)pRVar1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
             ,0x61);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  local_60 = Memory::Recycler::AllocInlined;
  local_58 = 0;
  this = (BoundFunction *)new<Memory::Recycler>(0x50,pRVar1,0x43c4b0);
  Arguments::Arguments(&local_70,&args->super_Arguments);
  this_00 = ScriptContext::GetLibrary((ScriptContext *)args_local);
  type = JavascriptLibrary::GetBoundFunctionType(this_00);
  BoundFunction(this,&local_70,type);
  return this;
}

Assistant:

BoundFunction* BoundFunction::New(ScriptContext* scriptContext, ArgumentReader args)
    {
        Recycler* recycler = scriptContext->GetRecycler();

        BoundFunction* boundFunc = RecyclerNew(recycler, BoundFunction, args,
            scriptContext->GetLibrary()->GetBoundFunctionType());
        return boundFunc;
    }